

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void glcts::ArraysOfArrays::initializeMap<glcts::ArraysOfArrays::Interface::GL>(void)

{
  uint in_EAX;
  mapped_type *pmVar1;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(1,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(2,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(3,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(4,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(5,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(6,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(7,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(8,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(9,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(10,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0xb,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0xc,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0xd,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0xe,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0xf,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x10,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x11,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x12,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x13,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x14,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x15,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x16,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x17,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x18,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x19,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1a,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1b,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1c,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1d,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1e,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x1f,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x20,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x21,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x22,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x23,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x24,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x25,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x26,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x27,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x28,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x29,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2a,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2b,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2c,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2d,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2e,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x2f,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x30,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x31,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x32,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x33,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x34,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x35,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x36,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x37,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x38,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x39,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x3a,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x3b,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x3c,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  uStack_38 = CONCAT44(0x3d,(undefined4)uStack_38);
  pmVar1 = std::
           map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
           ::operator[]((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                         *)supported_variable_types_map,(key_type *)((long)&uStack_38 + 4));
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->precision);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_ones);
  std::__cxx11::string::_M_assign((string *)&pmVar1->initializer_with_zeroes);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_initialization);
  std::__cxx11::string::_M_assign((string *)&pmVar1->iterator_type);
  std::__cxx11::string::_M_assign((string *)&pmVar1->specific_element);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer1);
  std::__cxx11::string::_M_assign((string *)&pmVar1->variable_type_initializer2);
  std::__cxx11::string::_M_assign((string *)&pmVar1->coord_param_for_texture_function);
  std::__cxx11::string::_M_assign((string *)&pmVar1->type_of_result_of_texture_function);
  return;
}

Assistant:

void initializeMap()
{
	int temp_index = 0;

	// Set up the map
	supported_variable_types_map[VAR_TYPE_BOOL]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_INT]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UINT]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_FLOAT]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC2]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC3]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_VEC4]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_BVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UVEC4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4]					= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT2X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT3X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X2]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X3]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_MAT4X4]				= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_IIMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_UIMAGEBUFFER]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLERBUFFER]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLERCUBESHADOW]	= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DSHADOW]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DARRAY]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_SAMPLER2DARRAYSHADOW] = var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_ISAMPLER2DARRAY]		= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER2D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER3D]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLERCUBE]			= var_descriptors[temp_index++];
	supported_variable_types_map[VAR_TYPE_USAMPLER2DARRAY]		= var_descriptors[temp_index++];

	if (API::USE_DOUBLE)
	{
		temp_index = 0;

		supported_variable_types_map[VAR_TYPE_DOUBLE]  = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4]   = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT2X4] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT3X4] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X2] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X3] = var_double_descriptors[temp_index++];
		supported_variable_types_map[VAR_TYPE_DMAT4X4] = var_double_descriptors[temp_index++];
	}
}